

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

void N_VDiv_ManyVector(N_Vector x,N_Vector y,N_Vector z)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)x->content;
  if (0 < *plVar1) {
    lVar2 = 0;
    do {
      N_VDiv(*(undefined8 *)(plVar1[2] + lVar2 * 8),
             *(undefined8 *)(*(long *)((long)y->content + 0x10) + lVar2 * 8),
             *(undefined8 *)(*(long *)((long)z->content + 0x10) + lVar2 * 8));
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
    } while (lVar2 < *plVar1);
  }
  return;
}

Assistant:

void MVAPPEND(N_VDiv)(N_Vector x, N_Vector y, N_Vector z)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    N_VDiv(MANYVECTOR_SUBVEC(x, i), MANYVECTOR_SUBVEC(y, i),
           MANYVECTOR_SUBVEC(z, i));
    SUNCheckLastErrVoid();
  }
  return;
}